

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.cpp
# Opt level: O1

void duckdb_zstd::ZSTD_buildFSETable_body_bmi2
               (ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,U32 *baseValue,
               U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize)

{
  ushort uVar1;
  sbyte sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  U16 *symbolNext;
  short sVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  U32 tableMask;
  uint uVar11;
  ulong uVar12;
  size_t u;
  undefined4 uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  sVar2 = ((byte)tableLog < 0x21) * (' ' - (byte)tableLog);
  uVar11 = (uint)(-1 << sVar2) >> sVar2;
  uVar13 = 1;
  uVar15 = 1 << (tableLog & 0x1f);
  uVar9 = maxSymbolValue + 1;
  uVar7 = uVar11;
  if (uVar9 != 0) {
    uVar19 = 0;
    uVar13 = 1;
    do {
      sVar5 = normalizedCounter[uVar19];
      if (sVar5 == -1) {
        uVar14 = (ulong)uVar7;
        uVar7 = uVar7 - 1;
        dt[uVar14 + 1].baseValue = (U32)uVar19;
        sVar5 = 1;
      }
      else if ((0x10000 << (tableLog - 1 & 0x1f)) >> 0x10 <= (int)sVar5) {
        uVar13 = 0;
      }
      *(short *)((long)wksp + uVar19 * 2) = sVar5;
      uVar19 = uVar19 + 1;
    } while (uVar9 != uVar19);
  }
  dt->nextState = (short)uVar13;
  dt->nbAdditionalBits = (char)((uint)uVar13 >> 0x10);
  dt->nbBits = (char)((uint)uVar13 >> 0x18);
  dt->baseValue = tableLog;
  auVar4 = _DAT_01df1070;
  auVar3 = _DAT_01de8e80;
  if (uVar7 == uVar11) {
    lVar10 = (long)wksp + 0x6a;
    iVar18 = (uVar15 >> 3) + (uVar15 >> 1) + 3;
    if (uVar9 != 0) {
      uVar14 = 0;
      uVar19 = (ulong)(0 >> sVar2);
      lVar16 = 0;
      do {
        uVar1 = normalizedCounter[uVar14];
        *(long *)(lVar10 + uVar19) = lVar16;
        if (8 < (long)(short)uVar1) {
          uVar6 = 0x10;
          if (0x10 < uVar1) {
            uVar6 = uVar1;
          }
          uVar12 = (ulong)uVar6 - 9;
          auVar22._8_4_ = (int)uVar12;
          auVar22._0_8_ = uVar12;
          auVar22._12_4_ = (int)(uVar12 >> 0x20);
          auVar20._0_8_ = uVar12 >> 3;
          auVar20._8_8_ = auVar22._8_8_ >> 3;
          auVar20 = auVar20 ^ auVar3;
          uVar8 = 0;
          do {
            auVar21._8_4_ = (int)uVar8;
            auVar21._0_8_ = uVar8;
            auVar21._12_4_ = (int)(uVar8 >> 0x20);
            auVar22 = (auVar21 | auVar4) ^ auVar3;
            if ((bool)(~(auVar20._4_4_ < auVar22._4_4_ ||
                        auVar20._0_4_ < auVar22._0_4_ && auVar22._4_4_ == auVar20._4_4_) & 1)) {
              *(long *)(lVar10 + uVar19 + 8 + uVar8 * 8) = lVar16;
            }
            if (auVar22._12_4_ <= auVar20._12_4_ &&
                (auVar22._8_4_ <= auVar20._8_4_ || auVar22._12_4_ != auVar20._12_4_)) {
              *(long *)(lVar10 + uVar19 + 0x10 + uVar8 * 8) = lVar16;
            }
            uVar8 = uVar8 + 2;
          } while (((uVar12 >> 3) + 2 & 0xfffffffffffffffe) != uVar8);
        }
        uVar19 = uVar19 + (long)(short)uVar1;
        uVar14 = uVar14 + 1;
        lVar16 = lVar16 + 0x101010101010101;
      } while (uVar14 != uVar9);
    }
    uVar19 = 0;
    uVar7 = 0;
    do {
      lVar16 = 0;
      uVar9 = uVar7;
      do {
        dt[(ulong)(uVar9 & uVar11) + 1].baseValue = (uint)*(byte *)(lVar10 + lVar16);
        lVar16 = lVar16 + 1;
        uVar9 = uVar9 + iVar18;
      } while (lVar16 == 1);
      uVar7 = uVar7 + iVar18 * 2 & uVar11;
      uVar19 = uVar19 + 2;
      lVar10 = lVar10 + 2;
    } while (uVar19 < uVar15);
  }
  else if (uVar9 != 0) {
    uVar19 = 0;
    uVar14 = 0;
    do {
      sVar5 = normalizedCounter[uVar19];
      if (0 < sVar5) {
        iVar18 = 0;
        do {
          dt[uVar14 + 1].baseValue = (U32)uVar19;
          do {
            uVar17 = (int)uVar14 + (uVar15 >> 3) + (uVar15 >> 1) + 3 & uVar11;
            uVar14 = (ulong)uVar17;
          } while (uVar7 < uVar17);
          iVar18 = iVar18 + 1;
        } while (iVar18 != sVar5);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar9);
  }
  uVar19 = 0;
  do {
    uVar14 = (ulong)dt[uVar19 + 1].baseValue;
    uVar1 = *(ushort *)((long)wksp + uVar14 * 2);
    *(ushort *)((long)wksp + uVar14 * 2) = uVar1 + 1;
    iVar18 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> iVar18 == 0; iVar18 = iVar18 + -1) {
      }
    }
    dt[uVar19 + 1].nbBits = (BYTE)(tableLog - iVar18);
    dt[uVar19 + 1].nextState = (uVar1 << (tableLog - iVar18 & 0x1f)) - (short)uVar15;
    dt[uVar19 + 1].nbAdditionalBits = nbAdditionalBits[uVar14];
    dt[uVar19 + 1].baseValue = baseValue[uVar14];
    uVar19 = uVar19 + 1;
  } while (uVar15 != uVar19);
  return;
}

Assistant:

BMI2_TARGET_ATTRIBUTE static void ZSTD_buildFSETable_body_bmi2(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize)
{
    ZSTD_buildFSETable_body(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}